

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O3

int main(int argc,char **argv)

{
  psocks_state *ps;
  
  ps = psocks_new(&platform);
  psocks_cmdline(ps,argc,argv);
  sk_init();
  uxsel_init();
  psocks_start(ps);
  cli_main_loop(psocks_pw_setup,psocks_pw_check,psocks_continue,(void *)0x0);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    psocks_state *ps = psocks_new(&platform);
    psocks_cmdline(ps, argc, argv);

    sk_init();
    uxsel_init();
    psocks_start(ps);

    cli_main_loop(psocks_pw_setup, psocks_pw_check, psocks_continue, NULL);
}